

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbar.cpp
# Opt level: O1

bool waitForPopup(QToolBar *tb,QWidget *popup)

{
  bool bVar1;
  QMenu *this;
  iterator iVar2;
  iterator iVar3;
  bool bVar4;
  QWidget *popup_00;
  long in_FS_OFFSET;
  QList<QObject_*> local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if ((popup != (QWidget *)0x0) && ((popup->data->widget_attributes & 0x10000) == 0)) {
    do {
      bVar4 = true;
      if (popup == &tb->super_QWidget) goto LAB_004b6492;
      popup = *(QWidget **)(*(long *)&popup->field_0x8 + 0x10);
    } while (popup != (QWidget *)0x0);
    this = (QMenu *)QMetaObject::cast((QObject *)&QMenu::staticMetaObject);
    if (this != (QMenu *)0x0) {
      QMenu::menuAction(this);
      QAction::associatedObjects();
      iVar2 = QList<QObject_*>::begin(&local_40);
      iVar3 = QList<QObject_*>::end(&local_40);
      for (; iVar2.i != iVar3.i; iVar2.i = iVar2.i + 1) {
        popup_00 = (QWidget *)*iVar2.i;
        if ((popup_00 == (QWidget *)0x0) ||
           ((*(byte *)(*(long *)&popup_00->field_0x8 + 0x30) & 1) == 0)) {
          popup_00 = (QWidget *)0x0;
        }
        if ((popup_00 != (QWidget *)0x0) && (bVar1 = waitForPopup(tb,popup_00), bVar1)) {
          if (&(local_40.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if (((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate(&(local_40.d.d)->super_QArrayData,8,0x10);
            }
          }
          goto LAB_004b6492;
        }
      }
      if (&(local_40.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_40.d.d)->super_QArrayData,8,0x10);
        }
      }
    }
  }
  bVar4 = false;
LAB_004b6492:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return bVar4;
  }
  __stack_chk_fail();
}

Assistant:

static bool waitForPopup(QToolBar *tb, QWidget *popup)
{
    if (popup == nullptr || popup->isHidden())
        return false;

    QWidget *w = popup;
    while (w != nullptr) {
        if (w == tb)
            return true;
        w = w->parentWidget();
    }

    QMenu *menu = qobject_cast<QMenu*>(popup);
    if (menu == nullptr)
        return false;

    const QAction *action = menu->menuAction();
    for (auto object : action->associatedObjects()) {
        if (QWidget *widget = qobject_cast<QWidget*>(object)) {
            if (waitForPopup(tb, widget))
                return true;
        }
    }

    return false;
}